

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,ImageSupport *this,OperationContext *context,Resource *resource)

{
  VkShaderStageFlagBits stage;
  ImageImplementation *this_00;
  
  stage = this->m_stage;
  this_00 = (ImageImplementation *)operator_new(0x110);
  if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
    ImageImplementation::ImageImplementation
              (this_00,context,resource,stage,&this->m_shaderPrefix,this->m_mode,
               PIPELINE_TYPE_GRAPHICS,this->m_dispatchCall);
  }
  else {
    ImageImplementation::ImageImplementation
              (this_00,context,resource,stage,&this->m_shaderPrefix,this->m_mode,
               PIPELINE_TYPE_COMPUTE,this->m_dispatchCall);
  }
  (__return_storage_ptr__->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = (Operation *)this_00;
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		if (m_stage & VK_SHADER_STAGE_COMPUTE_BIT)
			return de::MovePtr<Operation>(new ImageImplementation(context, resource, m_stage, m_shaderPrefix, m_mode, PIPELINE_TYPE_COMPUTE, m_dispatchCall));
		else
			return de::MovePtr<Operation>(new ImageImplementation(context, resource, m_stage, m_shaderPrefix, m_mode, PIPELINE_TYPE_GRAPHICS, m_dispatchCall));
	}